

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestAllTypesLite_NestedMessage::Clear(TestAllTypesLite_NestedMessage *this)

{
  RepeatedField<int> *this_00;
  anon_union_48_1_493b367e_for_TestAllTypesLite_NestedMessage_3 aVar1;
  int iVar2;
  bool is_soo;
  
  this_00 = &(this->field_0)._impl_.dd_;
  aVar1 = this->field_0;
  if (((undefined1  [48])aVar1 & (undefined1  [48])0x4) != (undefined1  [48])0x0) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  is_soo = ((undefined1  [48])aVar1 & (undefined1  [48])0x4) == (undefined1  [48])0x0;
  google::protobuf::internal::SooRep::size(&this_00->soo_rep_,is_soo);
  iVar2 = google::protobuf::internal::SooRep::size(&this_00->soo_rep_,is_soo);
  if ((iVar2 != 0) &&
     ((undefined1  [16])((undefined1  [16])(this_00->soo_rep_).field_0 & (undefined1  [16])0x4) !=
      (undefined1  [16])0x0)) {
    google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_00);
  }
  google::protobuf::RepeatedField<int>::set_size
            (this_00,((undefined1  [48])aVar1 & (undefined1  [48])0x4) == (undefined1  [48])0x0,0);
  if ((undefined1  [48])((undefined1  [48])this->field_0 & (undefined1  [48])0x3) !=
      (undefined1  [48])0x0) {
    (this->field_0)._impl_.bb_ = 0;
    (this->field_0)._impl_.cc_ = 0;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypesLite_NestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestAllTypesLite.NestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.dd_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    ::memset(&_impl_.cc_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.bb_) -
        reinterpret_cast<char*>(&_impl_.cc_)) + sizeof(_impl_.bb_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}